

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O1

void __thiscall SchemaAdapter::ShowBoolOverlay(SchemaAdapter *this,BoolEntry *entry)

{
  PrefsPtr local_38;
  _Any_data local_28;
  code *local_18;
  
  local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_28,&this->onChanged);
  cursespp::SchemaOverlay::ShowBoolOverlay
            (entry,&local_38,
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  if (local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ShowBoolOverlay(const ISchema::BoolEntry* entry) {
            SchemaOverlay::ShowBoolOverlay(entry, prefs, onChanged);
        }